

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucptrie.cpp
# Opt level: O1

int32_t ucptrie_internalSmallIndex_63(UCPTrie *trie,UChar32 c)

{
  ushort uVar1;
  uint16_t *puVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  
  iVar3 = (c >> 0xe) + 0x3fc;
  if (trie->type != '\0') {
    iVar3 = (c >> 0xe) + 0x40;
  }
  puVar2 = trie->index;
  uVar1 = puVar2[((uint)c >> 9 & 0x1f) + (uint)puVar2[iVar3]];
  uVar4 = (uint)c >> 4;
  if ((short)uVar1 < 0) {
    uVar5 = ((uVar4 & 0x1f) >> 3 | uVar4 & 0x18) + (uVar1 & 0x7fff);
    uVar4 = (uint)puVar2[(ulong)((uVar4 & 7) + uVar5) + 1] |
            (uint)puVar2[uVar5] << (char)(uVar4 & 7) * '\x02' + 2 & 0x30000;
  }
  else {
    uVar4 = (uint)puVar2[(uVar4 & 0x1f) + (uint)uVar1];
  }
  return (c & 0xfU) + uVar4;
}

Assistant:

U_CAPI int32_t U_EXPORT2
ucptrie_internalSmallIndex(const UCPTrie *trie, UChar32 c) {
    int32_t i1 = c >> UCPTRIE_SHIFT_1;
    if (trie->type == UCPTRIE_TYPE_FAST) {
        U_ASSERT(0xffff < c && c < trie->highStart);
        i1 += UCPTRIE_BMP_INDEX_LENGTH - UCPTRIE_OMITTED_BMP_INDEX_1_LENGTH;
    } else {
        U_ASSERT((uint32_t)c < (uint32_t)trie->highStart && trie->highStart > UCPTRIE_SMALL_LIMIT);
        i1 += UCPTRIE_SMALL_INDEX_LENGTH;
    }
    int32_t i3Block = trie->index[
        (int32_t)trie->index[i1] + ((c >> UCPTRIE_SHIFT_2) & UCPTRIE_INDEX_2_MASK)];
    int32_t i3 = (c >> UCPTRIE_SHIFT_3) & UCPTRIE_INDEX_3_MASK;
    int32_t dataBlock;
    if ((i3Block & 0x8000) == 0) {
        // 16-bit indexes
        dataBlock = trie->index[i3Block + i3];
    } else {
        // 18-bit indexes stored in groups of 9 entries per 8 indexes.
        i3Block = (i3Block & 0x7fff) + (i3 & ~7) + (i3 >> 3);
        i3 &= 7;
        dataBlock = ((int32_t)trie->index[i3Block++] << (2 + (2 * i3))) & 0x30000;
        dataBlock |= trie->index[i3Block + i3];
    }
    return dataBlock + (c & UCPTRIE_SMALL_DATA_MASK);
}